

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void sweep2old(lua_State *L,GCObject **p)

{
  byte bVar1;
  global_State *pgVar2;
  byte bVar3;
  GCObject *o;
  
  o = *p;
  if (o != (GCObject *)0x0) {
    pgVar2 = L->l_G;
    do {
      if ((o->marked & 0x18) == 0) {
        bVar3 = o->marked & 0xe0;
        bVar1 = bVar3 + 4;
        o->marked = bVar1;
        p = &o->next;
        if (o->tt == '\t') {
          if (o[1].next == (GCObject *)&o[1].tt) goto LAB_0012aa33;
        }
        else {
          if (o->tt != '\b') {
LAB_0012aa33:
            o->marked = bVar3 | 0x24;
            goto LAB_0012aa38;
          }
          *(GCObject **)&o[4].tt = pgVar2->grayagain;
          pgVar2->grayagain = o;
        }
        o->marked = bVar1 & 0xc4;
      }
      else {
        ((GCObject *)p)->next = o->next;
        freeobj(L,o);
      }
LAB_0012aa38:
      o = ((GCObject *)p)->next;
    } while (o != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void sweep2old (lua_State *L, GCObject **p) {
  GCObject *curr;
  global_State *g = G(L);
  while ((curr = *p) != NULL) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* all surviving objects become old */
      setage(curr, G_OLD);
      if (curr->tt == LUA_VTHREAD) {  /* threads must be watched */
        lua_State *th = gco2th(curr);
        linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
      }
      else if (curr->tt == LUA_VUPVAL && upisopen(gco2upv(curr)))
        set2gray(curr);  /* open upvalues are always gray */
      else  /* everything else is black */
        nw2black(curr);
      p = &curr->next;  /* go to next element */
    }
  }
}